

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

void btSoftBody::clusterDAImpulse(Cluster *cluster,btVector3 *impulse)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  
  fVar1 = impulse->m_floats[0];
  fVar2 = impulse->m_floats[1];
  fVar3 = impulse->m_floats[2];
  fVar4 = (cluster->m_invwi).m_el[2].m_floats[1];
  fVar5 = (cluster->m_invwi).m_el[2].m_floats[0];
  fVar6 = (cluster->m_invwi).m_el[2].m_floats[2];
  uVar7 = *(undefined8 *)cluster->m_dimpulses[1].m_floats;
  *(ulong *)cluster->m_dimpulses[1].m_floats =
       CONCAT44((float)((ulong)uVar7 >> 0x20) +
                fVar3 * (cluster->m_invwi).m_el[1].m_floats[2] +
                fVar1 * (cluster->m_invwi).m_el[1].m_floats[0] +
                (cluster->m_invwi).m_el[1].m_floats[1] * fVar2,
                (float)uVar7 +
                fVar3 * (cluster->m_invwi).m_el[0].m_floats[2] +
                fVar1 * (cluster->m_invwi).m_el[0].m_floats[0] +
                (cluster->m_invwi).m_el[0].m_floats[1] * fVar2);
  cluster->m_dimpulses[1].m_floats[2] =
       fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + cluster->m_dimpulses[1].m_floats[2];
  cluster->m_ndimpulses = cluster->m_ndimpulses + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}